

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

Offset<reflection::Enum>
reflection::CreateEnum
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_>
          values,bool is_union,Offset<reflection::Type> underlying_type,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,Offset<flatbuffers::String> declaration_file)

{
  Offset<reflection::Enum> OVar1;
  EnumBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  EnumBuilder::add_declaration_file(&local_40,declaration_file);
  EnumBuilder::add_documentation(&local_40,documentation);
  EnumBuilder::add_attributes(&local_40,attributes);
  EnumBuilder::add_underlying_type(&local_40,underlying_type);
  EnumBuilder::add_values(&local_40,values);
  EnumBuilder::add_name(&local_40,name);
  EnumBuilder::add_is_union(&local_40,is_union);
  OVar1 = EnumBuilder::Finish(&local_40);
  return (Offset<reflection::Enum>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Enum> CreateEnum(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::EnumVal>>> values = 0,
    bool is_union = false,
    ::flatbuffers::Offset<reflection::Type> underlying_type = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    ::flatbuffers::Offset<::flatbuffers::String> declaration_file = 0) {
  EnumBuilder builder_(_fbb);
  builder_.add_declaration_file(declaration_file);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_underlying_type(underlying_type);
  builder_.add_values(values);
  builder_.add_name(name);
  builder_.add_is_union(is_union);
  return builder_.Finish();
}